

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall wasm::PrintSExpression::visitExport(PrintSExpression *this,Export *curr)

{
  ostream *poVar1;
  char *in_RCX;
  char *pcVar2;
  variant<wasm::Name,_wasm::HeapType> *this_00;
  string_view str;
  string_view str_00;
  string_view str_01;
  stringstream local_1c8 [8];
  stringstream escaped;
  String local_1b8 [376];
  char *local_40;
  size_t local_38;
  
  std::operator<<(this->o,'(');
  str._M_str = "export ";
  str._M_len = 7;
  printMedium(this->o,str);
  std::__cxx11::stringstream::stringstream(local_1c8);
  str_01._M_str = in_RCX;
  str_01._M_len = (size_t)(curr->name).super_IString.str._M_str;
  String::printEscaped(local_1b8,(ostream *)(curr->name).super_IString.str._M_len,str_01);
  poVar1 = this->o;
  std::__cxx11::stringbuf::str();
  str_00._M_str = local_40;
  str_00._M_len = local_38;
  poVar1 = printText(poVar1,str_00,false);
  std::operator<<(poVar1," (");
  std::__cxx11::string::~string((string *)&local_40);
  switch(curr->kind) {
  case Function:
    pcVar2 = "func";
    break;
  case Table:
    pcVar2 = "table";
    break;
  case Memory:
    pcVar2 = "memory";
    break;
  case Global:
    pcVar2 = "global";
    break;
  case Tag:
    pcVar2 = "tag";
    break;
  case Invalid:
    handle_unreachable("invalid ExternalKind",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Print.cpp"
                       ,0xc0f);
  default:
    goto switchD_00b1a7e8_default;
  }
  std::operator<<(this->o,pcVar2);
switchD_00b1a7e8_default:
  std::operator<<(this->o,' ');
  this_00 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
  if (*(__index_type *)
       ((long)&(curr->value).super__Variant_base<wasm::Name,_wasm::HeapType>.
               super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
               super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
               super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
               super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
               super__Variant_storage_alias<wasm::Name,_wasm::HeapType> + 0x10) == '\0') {
    this_00 = &curr->value;
  }
  poVar1 = Name::print((Name *)this_00,this->o);
  std::operator<<(poVar1,"))");
  std::__cxx11::stringstream::~stringstream(local_1c8);
  return;
}

Assistant:

void PrintSExpression::visitExport(Export* curr) {
  o << '(';
  printMedium(o, "export ");
  std::stringstream escaped;
  String::printEscaped(escaped, curr->name.str);
  printText(o, escaped.str(), false) << " (";
  switch (curr->kind) {
    case ExternalKind::Function:
      o << "func";
      break;
    case ExternalKind::Table:
      o << "table";
      break;
    case ExternalKind::Memory:
      o << "memory";
      break;
    case ExternalKind::Global:
      o << "global";
      break;
    case ExternalKind::Tag:
      o << "tag";
      break;
    case ExternalKind::Invalid:
      WASM_UNREACHABLE("invalid ExternalKind");
  }
  o << ' ';
  // TODO: specific case for type exports
  curr->getInternalName()->print(o) << "))";
}